

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffdblk(fitsfile *fptr,long nblocks,int *status)

{
  LONGLONG *pLVar1;
  int iVar2;
  bool bVar3;
  long local_b80;
  LONGLONG writepos;
  LONGLONG readpos;
  int ii;
  int tstatus;
  char buffer [2880];
  int *status_local;
  long nblocks_local;
  fitsfile *fptr_local;
  
  if ((*status < 1) && (0 < nblocks)) {
    readpos._4_4_ = 0;
    writepos = ((fptr->Fptr->datastart + fptr->Fptr->heapstart + fptr->Fptr->heapsize + 0xb3f) /
               0xb40) * 0xb40;
    local_b80 = writepos + nblocks * -0xb40;
    buffer._2872_8_ = status;
    while( true ) {
      iVar2 = ffmbyt(fptr,writepos,0,(int *)((long)&readpos + 4));
      bVar3 = false;
      if (iVar2 == 0) {
        iVar2 = ffgbyt(fptr,0xb40,&ii,(int *)((long)&readpos + 4));
        bVar3 = iVar2 == 0;
      }
      if (!bVar3) {
        memset(&ii,0,0xb40);
        ffmbyt(fptr,local_b80,0,(int *)buffer._2872_8_);
        for (readpos._0_4_ = 0; (int)readpos < nblocks; readpos._0_4_ = (int)readpos + 1) {
          ffpbyt(fptr,0xb40,&ii,(int *)buffer._2872_8_);
        }
        ffmbyt(fptr,local_b80 + -1,0,(int *)buffer._2872_8_);
        fftrun(fptr,local_b80,(int *)buffer._2872_8_);
        for (readpos._0_4_ = fptr->Fptr->curhdu; (int)readpos <= fptr->Fptr->maxhdu;
            readpos._0_4_ = (int)readpos + 1) {
          pLVar1 = fptr->Fptr->headstart;
          pLVar1[(int)readpos + 1] = pLVar1[(int)readpos + 1] + nblocks * -0xb40;
        }
        return *(int *)buffer._2872_8_;
      }
      ffmbyt(fptr,local_b80,0,(int *)buffer._2872_8_);
      ffpbyt(fptr,0xb40,&ii,(int *)buffer._2872_8_);
      if (0 < *(int *)buffer._2872_8_) break;
      writepos = writepos + 0xb40;
      local_b80 = local_b80 + 0xb40;
    }
    ffpmsg("Error deleting FITS blocks (ffdblk)");
    fptr_local._4_4_ = *(int *)buffer._2872_8_;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffdblk(fitsfile *fptr,      /* I - FITS file pointer                    */
           long nblocks,        /* I - number of 2880-byte blocks to delete */
           int *status)         /* IO - error status                        */
/*
  Delete the specified number of 2880-byte blocks from the end
  of the CHDU by shifting all following extensions up this 
  number of blocks.
*/
{
    char buffer[2880];
    int tstatus, ii;
    LONGLONG readpos, writepos;

    if (*status > 0 || nblocks <= 0)
        return(*status);

    tstatus = 0;
    /* pointers to the read and write positions */

    readpos = (fptr->Fptr)->datastart + 
                   (fptr->Fptr)->heapstart + 
                   (fptr->Fptr)->heapsize;
    readpos = ((readpos + 2879) / 2880) * 2880; /* start of block */

/*  the following formula is wrong because the current data unit
    may have been extended without updating the headstart value
    of the following HDU.
    
    readpos = (fptr->Fptr)->headstart[((fptr->Fptr)->curhdu) + 1];
*/
    writepos = readpos - ((LONGLONG)nblocks * 2880);

    while ( !ffmbyt(fptr, readpos, REPORT_EOF, &tstatus) &&
            !ffgbyt(fptr, 2880L, buffer, &tstatus) )
    {
        ffmbyt(fptr, writepos, REPORT_EOF, status);
        ffpbyt(fptr, 2880L, buffer, status);

        if (*status > 0)
        {
           ffpmsg("Error deleting FITS blocks (ffdblk)");
           return(*status);
        }
        readpos  += 2880;  /* increment to next block to transfer */
        writepos += 2880;
    }

    /* now fill the last nblock blocks with zeros */
    memset(buffer, 0, 2880);
    ffmbyt(fptr, writepos, REPORT_EOF, status);

    for (ii = 0; ii < nblocks; ii++)
        ffpbyt(fptr, 2880L, buffer, status);

    /* move back before the deleted blocks, since they may be deleted */
    /*   and we do not want to delete the current active buffer */
    ffmbyt(fptr, writepos - 1, REPORT_EOF, status);

    /* truncate the file to the new size, if supported on this device */
    fftrun(fptr, writepos, status);

    /* recalculate the starting location of all subsequent HDUs */
    for (ii = (fptr->Fptr)->curhdu; ii <= (fptr->Fptr)->maxhdu; ii++)
         (fptr->Fptr)->headstart[ii + 1] -= ((LONGLONG)nblocks * 2880);

    return(*status);
}